

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.cpp
# Opt level: O1

void __thiscall Js::AsmJSByteCodeGenerator::LoadAllConstants(AsmJSByteCodeGenerator *this)

{
  FunctionBody *this_00;
  WriteBarrierPtr<void> *pWVar1;
  code *pcVar2;
  bool bVar3;
  uint32 uVar4;
  undefined4 *puVar5;
  WriteBarrierPtr<void> *byteTable;
  ulong uVar6;
  undefined1 local_50 [8];
  TypedConstSourcesInfo constSourcesInfo;
  
  this_00 = this->mFunction->mFuncBody;
  FunctionBody::CreateConstantTable(this_00);
  pWVar1 = (this_00->m_constTable).ptr;
  uVar4 = FunctionBody::GetCountField(this_00,ConstantCount);
  constSourcesInfo._16_8_ = this;
  WAsmJs::TypedRegisterAllocator::GetConstSourceInfos
            ((TypedConstSourcesInfo *)local_50,&this->mFunction->mTypedRegisterAllocator);
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  uVar6 = 0;
  do {
    if ((ulong)*(uint *)(local_50 + uVar6 * 4) != 0xffffffff) {
      byteTable = (WriteBarrierPtr<void> *)
                  ((long)&pWVar1->ptr + (ulong)*(uint *)(local_50 + uVar6 * 4));
      switch(uVar6 & 0xffffffff) {
      case 0:
        byteTable = (WriteBarrierPtr<void> *)
                    SetConstsToTable<int>
                              ((AsmJSByteCodeGenerator *)constSourcesInfo._16_8_,(byte *)byteTable,0
                              );
        break;
      case 1:
        SetConstsToTable<long>
                  ((AsmJSByteCodeGenerator *)constSourcesInfo._16_8_,(byte *)byteTable,0);
        break;
      case 2:
        byteTable = (WriteBarrierPtr<void> *)
                    SetConstsToTable<float>
                              ((AsmJSByteCodeGenerator *)constSourcesInfo._16_8_,(byte *)byteTable,
                               0.0);
        break;
      case 3:
        byteTable = (WriteBarrierPtr<void> *)
                    SetConstsToTable<double>
                              ((AsmJSByteCodeGenerator *)constSourcesInfo._16_8_,(byte *)byteTable,
                               0.0);
        break;
      case 4:
        byteTable = (WriteBarrierPtr<void> *)
                    SetConstsToTable<_SIMDValue>
                              ((AsmJSByteCodeGenerator *)constSourcesInfo._16_8_,(byte *)byteTable,
                               (_SIMDValue)ZEXT816(0));
        break;
      default:
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                                    ,0xa2,"(false)","false");
        if (!bVar3) goto LAB_00944dcb;
        *puVar5 = 0;
      }
      if (pWVar1 + uVar4 < byteTable) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                                    ,0xa7,"((0))","UNREACHED");
        if (bVar3) {
          *puVar5 = 0;
          Throw::FatalInternalError(-0x7fffbffb);
        }
LAB_00944dcb:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
    }
    uVar6 = uVar6 + 1;
    if (uVar6 == 5) {
      return;
    }
  } while( true );
}

Assistant:

void AsmJSByteCodeGenerator::LoadAllConstants()
    {
        FunctionBody *funcBody = mFunction->GetFuncBody();
        funcBody->CreateConstantTable();
        auto table = funcBody->GetConstTable();
        byte* tableEnd = (byte*)(table + funcBody->GetConstantCount());

        WAsmJs::TypedConstSourcesInfo constSourcesInfo = mFunction->GetTypedRegisterAllocator().GetConstSourceInfos();
        for (int i = 0; i < WAsmJs::LIMIT; ++i)
        {
            WAsmJs::Types type = (WAsmJs::Types)i;
            uint32 srcByteOffset = constSourcesInfo.srcByteOffsets[i];
            byte* byteTable = ((byte*)table) + srcByteOffset;
            if (srcByteOffset != Js::Constants::InvalidOffset)
            {
                switch (type)
                {
                case WAsmJs::INT32: byteTable = SetConstsToTable<int>(byteTable, 0); break;
                case WAsmJs::FLOAT32: byteTable = SetConstsToTable<float>(byteTable, 0); break;
                case WAsmJs::FLOAT64: byteTable = SetConstsToTable<double>(byteTable, 0); break;
#if TARGET_64
                case WAsmJs::INT64: SetConstsToTable<int64>(byteTable, 0); break;
#endif
                case WAsmJs::SIMD:
                {
                    AsmJsSIMDValue zeroValue;
                    zeroValue.f64[0] = 0; zeroValue.f64[1] = 0;
                    byteTable = SetConstsToTable<AsmJsSIMDValue>(byteTable, zeroValue);
                    break;
                }
                default:
                    Assert(false);
                    break;
                }
                if (byteTable > tableEnd)
                {
                    Assert(UNREACHED);
                    Js::Throw::FatalInternalError();
                }
            }
        }
    }